

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O0

void __thiscall
BufferInputSource::BufferInputSource
          (BufferInputSource *this,string *description,Buffer *buf,bool own_memory)

{
  qpdf_offset_t local_70;
  size_t local_40 [3];
  byte local_21;
  Buffer *pBStack_20;
  bool own_memory_local;
  Buffer *buf_local;
  string *description_local;
  BufferInputSource *this_local;
  
  local_21 = own_memory;
  pBStack_20 = buf;
  buf_local = (Buffer *)description;
  description_local = (string *)this;
  InputSource::InputSource(&this->super_InputSource);
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__BufferInputSource_0058e9b0;
  this->own_memory = (bool)(local_21 & 1);
  std::__cxx11::string::string((string *)&this->description,(string *)buf_local);
  this->buf = pBStack_20;
  this->cur_offset = 0;
  if (pBStack_20 == (Buffer *)0x0) {
    local_70 = 0;
  }
  else {
    local_40[0] = Buffer::getSize(pBStack_20);
    local_70 = QIntC::to_offset<unsigned_long>(local_40);
  }
  this->max_offset = local_70;
  return;
}

Assistant:

BufferInputSource::BufferInputSource(std::string const& description, Buffer* buf, bool own_memory) :
    own_memory(own_memory),
    description(description),
    buf(buf),
    cur_offset(0),
    max_offset(buf ? QIntC::to_offset(buf->getSize()) : 0)
{
}